

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_value * sqlite3_value_dup(sqlite3_value *pOrig)

{
  u16 uVar1;
  u8 uVar2;
  u8 uVar3;
  int iVar4;
  Mem *local_20;
  sqlite3_value *pNew;
  sqlite3_value *pOrig_local;
  
  if (pOrig == (sqlite3_value *)0x0) {
    pOrig_local = (sqlite3_value *)0x0;
  }
  else {
    local_20 = (Mem *)sqlite3_malloc(0x38);
    if (local_20 == (Mem *)0x0) {
      pOrig_local = (sqlite3_value *)0x0;
    }
    else {
      memset(local_20,0,0x38);
      local_20->u = pOrig->u;
      local_20->z = pOrig->z;
      uVar1 = pOrig->flags;
      uVar2 = pOrig->enc;
      uVar3 = pOrig->eSubtype;
      local_20->n = pOrig->n;
      local_20->flags = uVar1;
      local_20->enc = uVar2;
      local_20->eSubtype = uVar3;
      local_20->flags = local_20->flags & 0xefff;
      local_20->db = (sqlite3 *)0x0;
      if ((local_20->flags & 0x12) == 0) {
        if ((local_20->flags & 1) != 0) {
          local_20->flags = local_20->flags & 0xf5ff;
        }
      }
      else {
        local_20->flags = local_20->flags & 0xcfff;
        local_20->flags = local_20->flags | 0x4000;
        iVar4 = sqlite3VdbeMemMakeWriteable(local_20);
        if (iVar4 != 0) {
          sqlite3ValueFree(local_20);
          local_20 = (Mem *)0x0;
        }
      }
      pOrig_local = local_20;
    }
  }
  return pOrig_local;
}

Assistant:

SQLITE_API sqlite3_value *sqlite3_value_dup(const sqlite3_value *pOrig){
  sqlite3_value *pNew;
  if( pOrig==0 ) return 0;
  pNew = sqlite3_malloc( sizeof(*pNew) );
  if( pNew==0 ) return 0;
  memset(pNew, 0, sizeof(*pNew));
  memcpy(pNew, pOrig, MEMCELLSIZE);
  pNew->flags &= ~MEM_Dyn;
  pNew->db = 0;
  if( pNew->flags&(MEM_Str|MEM_Blob) ){
    pNew->flags &= ~(MEM_Static|MEM_Dyn);
    pNew->flags |= MEM_Ephem;
    if( sqlite3VdbeMemMakeWriteable(pNew)!=SQLITE_OK ){
      sqlite3ValueFree(pNew);
      pNew = 0;
    }
  }else if( pNew->flags & MEM_Null ){
    /* Do not duplicate pointer values */
    pNew->flags &= ~(MEM_Term|MEM_Subtype);
  }
  return pNew;
}